

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs2.c
# Opt level: O3

int Wlc_NtkAbsCore2(Wlc_Ntk_t *p,Wlc_Par_t *pPars)

{
  Wlc_Obj_t *pNode;
  uint uVar1;
  ushort uVar2;
  Wlc_Obj_t *pWVar3;
  Abc_Cex_t *pCex;
  int iVar4;
  int iVar5;
  Vec_Bit_t *vUnmark;
  int *piVar6;
  Vec_Int_t *vPisOld;
  Vec_Int_t *vPisNew;
  Vec_Int_t *vFlops;
  Vec_Bit_t *vLeaves;
  Wlc_Ntk_t *p_00;
  Gia_Man_t *pGVar7;
  Gia_Man_t *p_01;
  Aig_Man_t *pAig;
  void *__ptr;
  uint *puVar8;
  void *__s;
  Abc_Cex_t *p_02;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  size_t sVar19;
  ulong uVar20;
  char *__format;
  ulong uVar21;
  int *piVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  bool bVar28;
  timespec ts_1;
  Pdr_Par_t PdrPars;
  uint *local_160;
  int local_120;
  long local_108;
  timespec local_100;
  Pdr_Par_t local_f0;
  
  iVar4 = clock_gettime(3,(timespec *)&local_f0);
  if (iVar4 < 0) {
    local_108 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_f0._8_8_),8);
    local_108 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_f0._0_8_ * -1000000;
  }
  iVar4 = ((p->iObj >> 5) + 1) - (uint)((p->iObj & 0x1fU) == 0);
  vUnmark = (Vec_Bit_t *)malloc(0x10);
  vUnmark->nCap = iVar4 * 0x20;
  if (iVar4 == 0) {
    sVar19 = 0;
    piVar6 = (int *)0x0;
  }
  else {
    sVar19 = (long)iVar4 << 2;
    piVar6 = (int *)malloc(sVar19);
  }
  vUnmark->pArray = piVar6;
  vUnmark->nSize = iVar4 * 0x20;
  memset(piVar6,0,sVar19);
  Pdr_ManSetDefaultParams(&local_f0);
  local_f0.fUseAbs = 1;
  local_f0.fSkipDown = 0;
  local_f0.fCtgs = 1;
  local_f0.fVerbose = pPars->fPdrVerbose;
  if (pPars->nIterMax < 2) {
    local_120 = -1;
    uVar20 = 1;
  }
  else {
    uVar20 = 1;
    do {
      if (pPars->fVerbose == 0) {
        bVar28 = true;
      }
      else {
        printf("\nIteration %d:\n");
        bVar28 = pPars->fVerbose == 0;
      }
      vPisOld = (Vec_Int_t *)malloc(0x10);
      vPisOld->nCap = 100;
      vPisOld->nSize = 0;
      piVar6 = (int *)malloc(400);
      vPisOld->pArray = piVar6;
      vPisNew = (Vec_Int_t *)malloc(0x10);
      vPisNew->nCap = 100;
      vPisNew->nSize = 0;
      piVar6 = (int *)malloc(400);
      vPisNew->pArray = piVar6;
      vFlops = (Vec_Int_t *)malloc(0x10);
      vFlops->nCap = 100;
      vFlops->nSize = 0;
      piVar6 = (int *)malloc(400);
      vFlops->pArray = piVar6;
      uVar13 = p->iObj;
      iVar4 = (((int)uVar13 >> 5) + 1) - (uint)((uVar13 & 0x1f) == 0);
      vLeaves = (Vec_Bit_t *)malloc(0x10);
      uVar25 = iVar4 * 0x20;
      vLeaves->nCap = uVar25;
      if (iVar4 == 0) {
        sVar19 = 0;
        piVar6 = (int *)0x0;
      }
      else {
        sVar19 = (long)iVar4 << 2;
        piVar6 = (int *)malloc(sVar19);
      }
      vLeaves->pArray = piVar6;
      vLeaves->nSize = uVar25;
      uVar1 = 0;
      memset(piVar6,0,sVar19);
      uVar16 = 0;
      uVar24 = 0;
      if (1 < (int)uVar13) {
        uVar11 = (ulong)uVar25;
        uVar25 = p->nObjsAlloc;
        if (p->nObjsAlloc < 2) {
          uVar25 = 1;
        }
        uVar10 = 1;
        lVar15 = 0x24;
        uVar24 = 0;
        uVar16 = 0;
        uVar1 = 0;
        do {
          if (uVar25 == uVar10) goto LAB_0089926a;
          if ((long)vUnmark->nSize <= (long)uVar10) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          uVar21 = uVar10 >> 5 & 0x7ffffff;
          uVar23 = 1 << ((byte)uVar10 & 0x1f);
          if (((uint)vUnmark->pArray[uVar21] >> ((uint)uVar10 & 0x1f) & 1) == 0) {
            pWVar3 = p->pObjs;
            uVar2 = *(ushort *)((long)pWVar3 + lVar15 + -0xc);
            uVar26 = uVar2 & 0x3f;
            if (uVar26 < 0x33) {
              if ((0x1e00000000000U >> uVar26 & 1) == 0) {
                if ((0x4180000000000U >> uVar26 & 1) == 0) {
                  if (uVar26 != 8) goto LAB_00898829;
                  iVar5 = *(int *)((long)pWVar3 + lVar15 + -4) -
                          *(int *)(&pWVar3->field_0x0 + lVar15);
                  iVar4 = -iVar5;
                  if (0 < iVar5) {
                    iVar4 = iVar5;
                  }
                  if (pPars->nBitsMux <= iVar4 + 1) {
                    if (uVar11 <= uVar10) goto LAB_008992a8;
                    piVar6[uVar21] = piVar6[uVar21] | uVar23;
                    uVar24 = uVar24 + 1;
                  }
                }
                else {
                  iVar5 = *(int *)((long)pWVar3 + lVar15 + -4) -
                          *(int *)(&pWVar3->field_0x0 + lVar15);
                  iVar4 = -iVar5;
                  if (0 < iVar5) {
                    iVar4 = iVar5;
                  }
                  if (pPars->nBitsAdd <= iVar4 + 1) {
                    if (uVar11 <= uVar10) goto LAB_008992a8;
                    piVar6[uVar21] = piVar6[uVar21] | uVar23;
                    uVar1 = uVar1 + 1;
                  }
                }
              }
              else {
                iVar5 = *(int *)((long)pWVar3 + lVar15 + -4) - *(int *)(&pWVar3->field_0x0 + lVar15)
                ;
                iVar4 = -iVar5;
                if (0 < iVar5) {
                  iVar4 = iVar5;
                }
                if (pPars->nBitsMul <= iVar4 + 1) {
                  if (uVar11 <= uVar10) {
LAB_008992a8:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                                  ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
                  }
                  piVar6[uVar21] = piVar6[uVar21] | uVar23;
                  uVar16 = (ulong)((int)uVar16 + 1);
                }
              }
            }
            else {
LAB_00898829:
              if ((short)uVar26 != 1 && (uVar2 & 0x3d) == 1) {
                iVar5 = *(int *)((long)pWVar3 + lVar15 + -4) - *(int *)(&pWVar3->field_0x0 + lVar15)
                ;
                iVar4 = -iVar5;
                if (0 < iVar5) {
                  iVar4 = iVar5;
                }
                if (pPars->nBitsFlop <= iVar4 + 1) {
                  if (uVar11 <= uVar10) goto LAB_008992a8;
                  piVar6[uVar21] = piVar6[uVar21] | uVar23;
                }
              }
            }
          }
          uVar10 = uVar10 + 1;
          lVar15 = lVar15 + 0x18;
        } while (uVar13 != uVar10);
      }
      if (!bVar28) {
        printf("Abstraction engine marked %d adds/subs, %d muls/divs, %d muxes, and %d flops to be abstracted away.\n"
               ,(ulong)uVar1,uVar16,(ulong)uVar24);
      }
      Wlc_NtkCleanMarks(p);
      if ((p->vCos).nSize < 1) {
        iVar4 = 0;
      }
      else {
        lVar15 = 0;
        do {
          iVar4 = (p->vCos).pArray[lVar15];
          if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_0089926a;
          Wlc_NtkAbsMarkNodes_rec(p,p->pObjs + iVar4,vLeaves,vPisOld,vPisNew,vFlops);
          lVar15 = lVar15 + 1;
        } while (lVar15 < (p->vCos).nSize);
        iVar4 = vFlops->nSize;
        if (0 < iVar4) {
          lVar15 = 0;
          do {
            lVar17 = (long)vFlops->pArray[lVar15];
            if ((lVar17 < 1) || (p->nObjsAlloc <= vFlops->pArray[lVar15])) goto LAB_0089926a;
            pWVar3 = p->pObjs;
            if ((undefined1  [24])((undefined1  [24])pWVar3[lVar17] & (undefined1  [24])0x3f) !=
                (undefined1  [24])0x3) {
LAB_008992c7:
              __assert_fail("pObj->Type == WLC_OBJ_FO",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                            ,0x156,"Wlc_Obj_t *Wlc_ObjFo2Fi(Wlc_Ntk_t *, Wlc_Obj_t *)");
            }
            uVar13 = (pWVar3[lVar17].field_10.Fanins[1] + (p->vPos).nSize) - (p->vPis).nSize;
            if (((int)uVar13 < 0) || ((p->vCos).nSize <= (int)uVar13)) {
LAB_0089924b:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar13 = (p->vCos).pArray[uVar13];
            if (((long)(int)uVar13 < 1) || ((uint)p->nObjsAlloc <= uVar13)) goto LAB_0089926a;
            Wlc_NtkAbsMarkNodes_rec(p,pWVar3 + (int)uVar13,vLeaves,vPisOld,vPisNew,vFlops);
            lVar15 = lVar15 + 1;
            iVar4 = vFlops->nSize;
          } while (lVar15 < iVar4);
        }
      }
      if (1 < p->iObj) {
        iVar5 = p->nObjsAlloc;
        if (iVar5 < 2) {
          iVar5 = 1;
        }
        if (iVar5 - 1U <= p->iObj - 2U) {
LAB_0089926a:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
      }
      qsort(vPisOld->pArray,(long)vPisOld->nSize,4,Vec_IntSortCompare1);
      qsort(vPisNew->pArray,(long)vPisNew->nSize,4,Vec_IntSortCompare1);
      qsort(vFlops->pArray,(long)iVar4,4,Vec_IntSortCompare1);
      Wlc_NtkCleanMarks(p);
      if (piVar6 != (int *)0x0) {
        free(piVar6);
      }
      free(vLeaves);
      p_00 = Wlc_NtkDupDfsAbs(p,vPisOld,vPisNew,vFlops);
      if (vPisOld->pArray != (int *)0x0) {
        free(vPisOld->pArray);
      }
      free(vPisOld);
      if (vFlops->pArray != (int *)0x0) {
        free(vFlops->pArray);
      }
      free(vFlops);
      pGVar7 = Wlc_NtkBitBlast(p_00,(Wlc_BstPar_t *)0x0);
      iVar4 = Wlc_NtkDcFlopNum(p_00);
      p_01 = pGVar7;
      if (0 < iVar4) {
        iVar5 = Wlc_NtkCountObjBits(p,vPisNew);
        p_01 = Gia_ManPermuteInputs(pGVar7,iVar5,iVar4);
        Gia_ManStop(pGVar7);
      }
      pGVar7 = p_01;
      if (pPars->fXorOutput != 0) {
        pGVar7 = Gia_ManTransformMiter2(p_01);
        Gia_ManStop(p_01);
      }
      if (pPars->fVerbose != 0) {
        printf("Derived abstraction with %d objects and %d PPIs. Bit-blasted AIG stats are:\n",
               (ulong)(p_00->iObj - 1),(ulong)(uint)vPisNew->nSize);
        Gia_ManPrintStats(pGVar7,(Gps_Par_t *)0x0);
      }
      Wlc_NtkFree(p_00);
      pAig = Gia_ManToAigSimple(pGVar7);
      local_120 = Pdr_ManSolve(pAig,&local_f0);
      pCex = pAig->pSeqModel;
      pAig->pSeqModel = (Abc_Cex_t *)0x0;
      Aig_ManStop(pAig);
      if (pCex == (Abc_Cex_t *)0x0) {
        if (local_120 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs2.c"
                        ,0x16d,"int Wlc_NtkAbsCore2(Wlc_Ntk_t *, Wlc_Par_t *)");
        }
        Gia_ManStop(pGVar7);
        if (vPisNew->pArray != (int *)0x0) {
          free(vPisNew->pArray);
        }
        free(vPisNew);
        break;
      }
      local_160 = (uint *)malloc(0x10);
      local_160[0] = 100;
      local_160[1] = 0;
      __ptr = malloc(400);
      *(void **)(local_160 + 2) = __ptr;
      uVar13 = pCex->nPis;
      puVar8 = (uint *)malloc(0x10);
      uVar25 = uVar13;
      if (uVar13 - 1 < 0xf) {
        uVar25 = 0x10;
      }
      *puVar8 = uVar25;
      if (uVar25 == 0) {
        puVar8[2] = 0;
        puVar8[3] = 0;
        puVar8[1] = uVar13;
        __s = (void *)0x0;
      }
      else {
        __s = malloc((long)(int)uVar25 << 2);
        *(void **)(puVar8 + 2) = __s;
        puVar8[1] = uVar13;
        if (__s == (void *)0x0) {
          __s = (void *)0x0;
        }
        else {
          memset(__s,0xff,(long)(int)uVar13 << 2);
        }
      }
      iVar4 = vPisNew->nSize;
      if ((long)iVar4 < 1) {
        uVar25 = 0;
      }
      else {
        piVar6 = vPisNew->pArray;
        lVar15 = 0;
        uVar25 = 0;
        do {
          iVar5 = piVar6[lVar15];
          lVar17 = (long)iVar5;
          if ((lVar17 < 1) || (p->nObjsAlloc <= iVar5)) goto LAB_0089926a;
          if ((int)uVar25 < 0) {
LAB_00899289:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pWVar3 = p->pObjs;
          uVar1 = uVar13;
          if ((int)uVar13 < (int)uVar25) {
            uVar1 = uVar25;
          }
          piVar22 = (int *)((long)__s + (ulong)uVar25 * 4);
          uVar24 = 0xffffffff;
          do {
            if (uVar1 == uVar25) goto LAB_00899289;
            *piVar22 = iVar5;
            uVar26 = pWVar3[lVar17].End - pWVar3[lVar17].Beg;
            uVar23 = -uVar26;
            if (0 < (int)uVar26) {
              uVar23 = uVar26;
            }
            piVar22 = piVar22 + 1;
            uVar25 = uVar25 + 1;
            uVar24 = uVar24 + 1;
          } while (uVar24 < uVar23);
          lVar15 = lVar15 + 1;
        } while (lVar15 != iVar4);
      }
      iVar5 = uVar13 - uVar25;
      p_02 = Bmc_CexCareMinimizeAig(pGVar7,iVar5,pCex,1,0,0);
      iVar4 = p_02->nPis;
      if (iVar4 != pCex->nPis) {
        __assert_fail("pCexCare->nPis == pCex->nPis",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs2.c"
                      ,0xcf,
                      "Vec_Int_t *Wlc_NtkAbsRefinement(Wlc_Ntk_t *, Gia_Man_t *, Abc_Cex_t *, Vec_Int_t *)"
                     );
      }
      iVar14 = p_02->iFrame;
      if (-1 < iVar14) {
        iVar9 = iVar4;
        iVar27 = 0;
        do {
          iVar18 = iVar5;
          if (iVar5 < iVar9) {
            do {
              uVar13 = iVar9 * iVar27 + iVar18 + p_02->nRegs;
              if (((uint)(&p_02[1].iPo)[(int)uVar13 >> 5] >> (uVar13 & 0x1f) & 1) != 0) {
                uVar13 = iVar18 - iVar5;
                if (((int)uVar13 < 0) || ((int)puVar8[1] <= (int)uVar13)) goto LAB_0089924b;
                iVar14 = *(int *)((long)__s + (ulong)uVar13 * 4);
                uVar13 = local_160[1];
                uVar16 = (ulong)uVar13;
                if (0 < (int)uVar13) {
                  uVar11 = 0;
                  do {
                    if (*(int *)((long)__ptr + uVar11 * 4) == iVar14) goto LAB_00898e90;
                    uVar11 = uVar11 + 1;
                  } while (uVar16 != uVar11);
                }
                if (uVar13 == *local_160) {
                  if ((int)uVar13 < 0x10) {
                    if (__ptr == (void *)0x0) {
                      __ptr = malloc(0x40);
                    }
                    else {
                      __ptr = realloc(__ptr,0x40);
                    }
                    *(void **)(local_160 + 2) = __ptr;
                    uVar25 = 0x10;
                    if (__ptr == (void *)0x0) {
LAB_008992e6:
                      __assert_fail("p->pArray",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                    }
                  }
                  else {
                    if (__ptr == (void *)0x0) {
                      __ptr = malloc(uVar16 * 8);
                    }
                    else {
                      __ptr = realloc(__ptr,uVar16 * 8);
                    }
                    *(void **)(local_160 + 2) = __ptr;
                    if (__ptr == (void *)0x0) goto LAB_008992e6;
                    uVar25 = uVar13 * 2;
                  }
                  *local_160 = uVar25;
                }
                local_160[1] = uVar13 + 1;
                if (0 < (int)uVar13) {
                  do {
                    iVar4 = *(int *)((long)__ptr + uVar16 * 4 + -4);
                    if (iVar4 <= iVar14) goto LAB_00898e84;
                    *(int *)((long)__ptr + uVar16 * 4) = iVar4;
                    bVar28 = 1 < uVar16;
                    uVar16 = uVar16 - 1;
                  } while (bVar28);
                  uVar16 = 0;
                }
LAB_00898e84:
                *(int *)((long)__ptr + (long)(int)uVar16 * 4) = iVar14;
                iVar4 = p_02->nPis;
              }
LAB_00898e90:
              iVar18 = iVar18 + 1;
              iVar9 = iVar4;
            } while (iVar18 < iVar4);
            iVar14 = p_02->iFrame;
          }
          bVar28 = iVar27 < iVar14;
          iVar27 = iVar27 + 1;
        } while (bVar28);
      }
      Abc_CexFree(p_02);
      if (*(void **)(puVar8 + 2) != (void *)0x0) {
        free(*(void **)(puVar8 + 2));
      }
      free(puVar8);
      if (local_160[1] == 0) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        free(local_160);
        local_160 = (uint *)0x0;
      }
      Gia_ManStop(pGVar7);
      if (vPisNew->pArray != (int *)0x0) {
        free(vPisNew->pArray);
      }
      free(vPisNew);
      if (local_160 == (uint *)0x0) {
        Abc_CexFree(pCex);
        break;
      }
      if ((p->vRefs).nSize == 0) {
        Wlc_NtkSetRefs(p);
      }
      uVar16 = (ulong)local_160[1];
      if ((int)local_160[1] < 1) {
        uVar13 = 0;
      }
      else {
        lVar15 = 0;
        uVar13 = 0;
        do {
          iVar4 = *(int *)(*(long *)(local_160 + 2) + lVar15 * 4);
          lVar17 = (long)iVar4;
          if ((lVar17 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_0089926a;
          pWVar3 = p->pObjs;
          while (pNode = pWVar3 + lVar17,
                (undefined1  [24])((undefined1  [24])*pNode & (undefined1  [24])0x3d) ==
                (undefined1  [24])0x1) {
            lVar17 = ((long)pNode - (long)pWVar3 >> 3) * -0x5555555555555555;
            uVar25 = (uint)lVar17;
            if (((int)uVar25 < 0) || (vUnmark->nSize <= (int)uVar25)) goto LAB_008992a8;
            puVar8 = (uint *)((long)vUnmark->pArray + (ulong)(uVar25 >> 3 & 0xffffffc));
            *puVar8 = *puVar8 | 1 << ((byte)lVar17 & 0x1f);
            if ((undefined1  [24])((undefined1  [24])*pNode & (undefined1  [24])0x3f) !=
                (undefined1  [24])0x3) goto LAB_008992c7;
            uVar25 = ((pNode->field_10).Fanins[1] + (p->vPos).nSize) - (p->vPis).nSize;
            if (((int)uVar25 < 0) || ((p->vCos).nSize <= (int)uVar25)) goto LAB_0089924b;
            iVar4 = (p->vCos).pArray[uVar25];
            lVar17 = (long)iVar4;
            if ((lVar17 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_0089926a;
          }
          iVar4 = Wlc_NtkNodeDeref_rec(p,pNode,vUnmark);
          iVar5 = Wlc_NtkNodeRef_rec(p,pNode);
          if (iVar4 != iVar5) {
            __assert_fail("Count1 == Count2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs2.c"
                          ,0x111,"int Wlc_NtkMarkMffc(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Bit_t *)");
          }
          uVar13 = uVar13 + iVar4;
          lVar15 = lVar15 + 1;
          uVar16 = (ulong)(int)local_160[1];
        } while (lVar15 < (long)uVar16);
      }
      if (pPars->fVerbose != 0) {
        printf("Refinement of CEX in frame %d came up with %d un-abstacted PPIs, whose MFFCs include %d objects.\n"
               ,(ulong)(uint)pCex->iFrame,uVar16,(ulong)uVar13);
      }
      if (*(void **)(local_160 + 2) != (void *)0x0) {
        free(*(void **)(local_160 + 2));
      }
      free(local_160);
      Abc_CexFree(pCex);
      uVar13 = (int)uVar20 + 1;
      uVar20 = (ulong)uVar13;
    } while ((int)uVar13 < pPars->nIterMax);
  }
  if (vUnmark->pArray != (int *)0x0) {
    free(vUnmark->pArray);
  }
  free(vUnmark);
  if (pPars->fVerbose != 0) {
    putchar(10);
  }
  printf("Abstraction ");
  pcVar12 = "timed out";
  if (local_120 == 1) {
    pcVar12 = "is successfully proved";
  }
  __format = "resulted in a real CEX";
  if (local_120 != 0) {
    __format = pcVar12;
  }
  printf(__format);
  printf(" after %d iterations. ",uVar20);
  iVar5 = 3;
  iVar4 = clock_gettime(3,&local_100);
  if (iVar4 < 0) {
    lVar15 = -1;
  }
  else {
    lVar15 = local_100.tv_nsec / 1000 + local_100.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%s =","Time");
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar15 + local_108) / 1000000.0);
  return local_120;
}

Assistant:

int Wlc_NtkAbsCore2( Wlc_Ntk_t * p, Wlc_Par_t * pPars )
{
    abctime clk = Abc_Clock();
    int nIters, nNodes, nDcFlops, RetValue = -1;
    // start the bitmap to mark objects that cannot be abstracted because of refinement
    // currently, this bitmap is empty because abstraction begins without refinement
    Vec_Bit_t * vUnmark = Vec_BitStart( Wlc_NtkObjNumMax(p) );
    // set up parameters to run PDR
    Pdr_Par_t PdrPars, * pPdrPars = &PdrPars;
    Pdr_ManSetDefaultParams( pPdrPars );
    pPdrPars->fUseAbs    = 1;   // use 'pdr -t'  (on-the-fly abstraction)
    pPdrPars->fCtgs      = 1;   // use 'pdr -nc' (improved generalization)
    pPdrPars->fSkipDown  = 0;   // use 'pdr -nc' (improved generalization)
    //pPdrPars->nRestLimit = 500; // reset queue or proof-obligations when it gets larger than this
    pPdrPars->fVerbose   = pPars->fPdrVerbose;
    // perform refinement iterations
    for ( nIters = 1; nIters < pPars->nIterMax; nIters++ )
    {
        Aig_Man_t * pAig;
        Abc_Cex_t * pCex;
        Vec_Int_t * vPisNew, * vRefine;  
        Gia_Man_t * pGia, * pTemp;
        Wlc_Ntk_t * pAbs;

        if ( pPars->fVerbose )
            printf( "\nIteration %d:\n", nIters );

        // get abstracted GIA and the set of pseudo-PIs (vPisNew)
        pAbs = Wlc_NtkAbs( p, pPars, vUnmark, &vPisNew, pPars->fVerbose );
        pGia = Wlc_NtkBitBlast( pAbs, NULL );

        // if the abstraction has flops with DC-init state,
        // new PIs were introduced by bit-blasting at the end of the PI list
        // here we move these variables to be *before* PPIs, because
        // PPIs are supposed to be at the end of the PI list for refinement
        nDcFlops = Wlc_NtkDcFlopNum(pAbs);
        if ( nDcFlops > 0 ) // DC-init flops are present
        {
            pGia = Gia_ManPermuteInputs( pTemp = pGia, Wlc_NtkCountObjBits(p, vPisNew), nDcFlops );
            Gia_ManStop( pTemp );
        }
        // if the word-level outputs have to be XORs, this is a place to do it
        if ( pPars->fXorOutput )
        {
            pGia = Gia_ManTransformMiter2( pTemp = pGia );
            Gia_ManStop( pTemp );
        }
        if ( pPars->fVerbose )
        {
            printf( "Derived abstraction with %d objects and %d PPIs. Bit-blasted AIG stats are:\n", Wlc_NtkObjNum(pAbs), Vec_IntSize(vPisNew) ); 
            Gia_ManPrintStats( pGia, NULL );
        }
        Wlc_NtkFree( pAbs );

        // try to prove abstracted GIA by converting it to AIG and calling PDR
        pAig = Gia_ManToAigSimple( pGia );
        RetValue = Pdr_ManSolve( pAig, pPdrPars );
        pCex = pAig->pSeqModel; pAig->pSeqModel = NULL;
        Aig_ManStop( pAig );

        // consider outcomes
        if ( pCex == NULL ) 
        {
            assert( RetValue ); // proved or undecided
            Gia_ManStop( pGia );
            Vec_IntFree( vPisNew );
            break;
        }

        // perform refinement
        vRefine = Wlc_NtkAbsRefinement( p, pGia, pCex, vPisNew );
        Gia_ManStop( pGia );
        Vec_IntFree( vPisNew );
        if ( vRefine == NULL ) // real CEX
        {
            Abc_CexFree( pCex ); // return CEX in the future
            break;
        }

        // update the set of objects to be un-abstracted
        nNodes = Wlc_NtkRemoveFromAbstraction( p, vRefine, vUnmark );
        if ( pPars->fVerbose )
            printf( "Refinement of CEX in frame %d came up with %d un-abstacted PPIs, whose MFFCs include %d objects.\n", pCex->iFrame, Vec_IntSize(vRefine), nNodes );
        Vec_IntFree( vRefine );
        Abc_CexFree( pCex );
    }
    Vec_BitFree( vUnmark );
    // report the result
    if ( pPars->fVerbose )
        printf( "\n" );
    printf( "Abstraction " );
    if ( RetValue == 0 )
        printf( "resulted in a real CEX" );
    else if ( RetValue == 1 )
        printf( "is successfully proved" );
    else 
        printf( "timed out" );
    printf( " after %d iterations. ", nIters );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return RetValue;
}